

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.h
# Opt level: O2

void __thiscall
llvm::
formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
::formatv_object(formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
                 *this,StringRef Fmt,
                tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                *Params)

{
  _Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
  local_40;
  detail local_21;
  
  formatv_object_base::formatv_object_base(&this->super_formatv_object_base,Fmt,3);
  std::
  _Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
  ::_Tuple_impl(&(this->Parameters).
                 super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                ,&Params->
                  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
               );
  detail::
  apply_tuple_impl<llvm::formatv_object_base::create_adapters,std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,llvm::detail::provider_format_adapter<unsigned_long&>,llvm::detail::provider_format_adapter<unsigned_int&>>&,0ul,1ul,2ul>
            (&local_40,&local_21,&this->Parameters);
  std::vector<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>::
  _M_move_assign(&(this->super_formatv_object_base).Adapters,&local_40);
  std::_Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
  ::~_Vector_base(&local_40);
  return;
}

Assistant:

formatv_object(StringRef Fmt, Tuple &&Params)
      : formatv_object_base(Fmt, std::tuple_size<Tuple>::value),
        Parameters(std::move(Params)) {
    Adapters = apply_tuple(create_adapters(), Parameters);
  }